

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

int run_normal_process(ThreadedReplayer *replayer,
                      vector<const_char_*,_std::allocator<const_char_*>_> *databases,char *whitelist
                      ,uint32_t whitelist_mask,intptr_t metadata_handle)

{
  pointer *this;
  ResourceTag tag_00;
  unsigned_long uVar1;
  __int_type_conflict1 _Var2;
  char *pcVar3;
  FILE *pFVar4;
  pointer *ppuVar5;
  bool bVar6;
  uint uVar7;
  pointer pDVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar9;
  unsigned_long *puVar10;
  PerThreadData *pPVar11;
  reference puVar12;
  uchar *puVar13;
  size_type size;
  uint *puVar14;
  type iface;
  ScratchAllocator *pSVar15;
  iterator iVar16;
  iterator iVar17;
  size_type sVar18;
  size_type sVar19;
  size_type sVar20;
  size_type sVar21;
  size_t sVar22;
  size_type sVar23;
  ulong uVar24;
  pointer this_01;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_518;
  duration<long,_std::ratio<1L,_1000000000L>_> local_510;
  duration<long,_std::ratio<1L,_1000L>_> local_508;
  rep local_500;
  long elapsed_ms;
  duration<long,_std::ratio<1L,_1000L>_> local_4f0;
  rep local_4e8;
  long elapsed_ms_read_archive;
  duration<long,_std::ratio<1L,_1000L>_> local_4d8;
  rep local_4d0;
  long elapsed_ms_prepare;
  unsigned_long total_size;
  anon_class_8_1_ce461c52 run_work;
  undefined1 local_470 [8];
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> raytracing_workload;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> compute_workload;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> graphics_workload;
  size_t state_json_size_2;
  unsigned_long *hash_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3f8;
  const_iterator local_3f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e0;
  const_iterator local_3d8;
  unsigned_long *local_3d0;
  unsigned_long *local_3c8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3c0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a8;
  pointer *local_3a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes;
  uint end_index;
  uint start_index;
  size_t resource_hash_count_1;
  size_t tag_total_size_compressed_1;
  size_t tag_total_size_1;
  ResourceTag *tag_2;
  ResourceTag *__end2_2;
  ResourceTag *__begin2_2;
  ResourceTag (*__range2_2) [3];
  size_t state_json_size_1;
  ResourceTag *tag_1;
  ResourceTag *__end2_1;
  ResourceTag *__begin2_1;
  ResourceTag (*__range2_1) [3];
  uint local_328;
  uint raytracing_start_index;
  uint compute_start_index;
  uint graphics_start_index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> raytracing_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> compute_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> graphics_hashes;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2d0;
  rep local_2c8;
  rep duration;
  time_point main_thread_end;
  size_t state_json_size;
  unsigned_long *hash;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  PerThreadData *per_thread_data;
  size_t resource_hash_count;
  size_t tag_total_size_compressed;
  size_t tag_total_size;
  time_point main_thread_start;
  ResourceTag *tag;
  ResourceTag *__end1;
  ResourceTag *__begin1;
  ResourceTag (*__range1) [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resource_hashes;
  StateReplayer state_replayer;
  time_point end_prepare;
  time_point start_prepare;
  time_point end_create_archive;
  iterator iStack_1f0;
  uint index;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  resolver;
  time_point start_create_archive;
  time_point start_time;
  intptr_t metadata_handle_local;
  uint32_t whitelist_mask_local;
  char *whitelist_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *databases_local;
  ThreadedReplayer *replayer_local;
  memory_order __b_15;
  memory_order __b_14;
  memory_order __b_13;
  memory_order __b_12;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_5;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  
  start_create_archive.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  resolver._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
        )std::chrono::_V2::steady_clock::now();
  create_database((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xfffffffffffffe30);
  if (whitelist != (char *)0x0) {
    pDVar8 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)&stack0xfffffffffffffe30);
    Fossilize::DatabaseInterface::set_whitelist_tag_mask(pDVar8,whitelist_mask);
    pDVar8 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)&stack0xfffffffffffffe30);
    bVar6 = Fossilize::DatabaseInterface::load_whitelist_database(pDVar8,whitelist);
    if (!bVar6) {
      fprintf(_stderr,"Fossilize ERROR: Failed to load whitelist database: %s.\n",whitelist);
      fflush(_stderr);
      replayer_local._4_4_ = 1;
      goto LAB_0012da2e;
    }
    pDVar8 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)&stack0xfffffffffffffe30);
    uVar7 = (*pDVar8->_vptr_DatabaseInterface[10])();
    if ((uVar7 & 1) != 0) {
      this_00 = &(replayer->opts).implicit_whitelist_database_indices;
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
      iStack_1f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
      while (bVar6 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe10), bVar6) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        uVar7 = *puVar9;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(pDVar8,uVar7);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
    }
  }
  bVar6 = Fossilize::DatabaseInterface::metadata_handle_is_valid(metadata_handle);
  if (bVar6) {
    pDVar8 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)&stack0xfffffffffffffe30);
    bVar6 = Fossilize::DatabaseInterface::import_metadata_from_os_handle(pDVar8,metadata_handle);
    if (!bVar6) {
      fprintf(_stderr,"Fossilize ERROR: Failed to import metadata.\n");
      fflush(_stderr);
      replayer_local._4_4_ = 1;
      goto LAB_0012da2e;
    }
  }
  start_prepare.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  end_prepare.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  pDVar8 = std::
           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         *)&stack0xfffffffffffffe30);
  uVar7 = (*pDVar8->_vptr_DatabaseInterface[2])();
  if ((uVar7 & 1) == 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to prepare database.\n");
    fflush(_stderr);
    replayer_local._4_4_ = 1;
    goto LAB_0012da2e;
  }
  state_replayer.impl = (Impl *)std::chrono::_V2::steady_clock::now();
  Fossilize::StateReplayer::StateReplayer
            ((StateReplayer *)
             &resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles
            ((StateReplayer *)
             &resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,false);
  Fossilize::StateReplayer::set_resolve_shader_module_handles
            ((StateReplayer *)
             &resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,false);
  replayer->global_replayer =
       (StateReplayer *)
       &resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  pDVar8 = std::
           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ::get((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  *)&stack0xfffffffffffffe30);
  replayer->global_database = pDVar8;
  bVar6 = ThreadedReplayer::init_implicit_whitelist(replayer);
  if (bVar6) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    for (__end1 = run_normal_process::initial_playback_order;
        __end1 != run_normal_process::threaded_playback_order; __end1 = __end1 + 1) {
      main_thread_start.__d.__r = (duration)(duration)__end1;
      tag_total_size = std::chrono::_V2::steady_clock::now();
      tag_total_size_compressed = 0;
      resource_hash_count = 0;
      per_thread_data = (PerThreadData *)0x0;
      pDVar8 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)&stack0xfffffffffffffe30);
      uVar7 = (*pDVar8->_vptr_DatabaseInterface[6])
                        (pDVar8,(ulong)*(uint *)main_thread_start.__d.__r,&per_thread_data,0);
      if ((uVar7 & 1) == 0) {
        fprintf(_stderr,"Fossilize ERROR: Failed to get list of resource hashes.\n");
        fflush(_stderr);
        replayer_local._4_4_ = 1;
        goto LAB_0012da0a;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)per_thread_data);
      pDVar8 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)&stack0xfffffffffffffe30);
      uVar7 = *(uint *)main_thread_start.__d.__r;
      puVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &state_json.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar7 = (*pDVar8->_vptr_DatabaseInterface[6])(pDVar8,(ulong)uVar7,&per_thread_data,puVar10);
      if ((uVar7 & 1) == 0) {
        fprintf(_stderr,"Fossilize ERROR: Failed to get list of resource hashes.\n");
        fflush(_stderr);
        replayer_local._4_4_ = 1;
        goto LAB_0012da0a;
      }
      pPVar11 = ThreadedReplayer::get_per_thread_data(replayer);
      pPVar11->expected_tag = *(ResourceTag *)main_thread_start.__d.__r;
      this = &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      hash = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&hash), bVar6) {
        puVar12 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&__end2);
        main_thread_end.__d.__r = (duration)0;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                          (pDVar8,(ulong)*(uint *)main_thread_start.__d.__r,*puVar12,
                           &main_thread_end,0);
        if ((uVar7 & 1) != 0) {
          resource_hash_count = (long)main_thread_end.__d.__r + resource_hash_count;
        }
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                          (pDVar8,(ulong)*(uint *)main_thread_start.__d.__r,*puVar12,
                           &main_thread_end,0);
        if ((uVar7 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
          fflush(_stderr);
          replayer_local._4_4_ = 1;
          goto LAB_0012da0a;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,
                   (size_type)main_thread_end.__d.__r);
        tag_total_size_compressed = (long)main_thread_end.__d.__r + tag_total_size_compressed;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = *(uint *)main_thread_start.__d.__r;
        uVar1 = *puVar12;
        puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                          (pDVar8,(ulong)uVar7,uVar1,&main_thread_end,puVar13);
        if ((uVar7 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
          fflush(_stderr);
          replayer_local._4_4_ = 1;
          goto LAB_0012da0a;
        }
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::get((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                        *)&stack0xfffffffffffffe30);
        puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
        size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
        bVar6 = Fossilize::StateReplayer::parse
                          ((StateReplayer *)
                           &resource_hashes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           &replayer->super_StateCreatorInterface,pDVar8,puVar13,size);
        if (!bVar6) {
          fprintf(_stderr,
                  "Fossilize WARN: Did not replay blob (tag: %s, hash: %016lx). See previous logs for context.\n"
                  ,run_normal_process::tag_names[*(uint *)main_thread_start.__d.__r],*puVar12);
          fflush(_stderr);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
      if (*(int *)main_thread_start.__d.__r == 0) {
        (*(replayer->super_StateCreatorInterface)._vptr_StateCreatorInterface[2])(replayer,0,0);
      }
      fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
              run_normal_process::tag_names[*(uint *)main_thread_start.__d.__r],
              tag_total_size_compressed);
      fflush(_stderr);
      duration = std::chrono::_V2::steady_clock::now();
      graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::chrono::operator-
                              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&duration,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&tag_total_size);
      local_2d0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           &graphics_hashes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2c8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_2d0);
      fprintf(_stderr,"Fossilize INFO: Total time decoding %s in main thread: %.3f s\n",
              (double)local_2c8 * 1e-09,
              run_normal_process::tag_names[*(uint *)main_thread_start.__d.__r]);
      fflush(_stderr);
    }
    heartbeat();
    ThreadedReplayer::start_worker_threads(replayer);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compute_start_index);
    raytracing_start_index = 0;
    local_328 = 0;
    __range2_1._4_4_ = 0;
    if ((replayer->opts).pipeline_hash == 0) {
      __begin2_2 = run_normal_process::threaded_playback_order;
      tag_2 = (ResourceTag *)&DAT_003bb2ec;
      for (__end2_2 = run_normal_process::threaded_playback_order; __end2_2 != tag_2;
          __end2_2 = __end2_2 + 1) {
        tag_total_size_1 = (size_t)__end2_2;
        tag_total_size_compressed_1 = 0;
        resource_hash_count_1 = 0;
        _end_index = 0;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[6])
                          (pDVar8,(ulong)*(uint *)tag_total_size_1,&end_index,0);
        if ((uVar7 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to get list of resource hashes.\n");
          fflush(_stderr);
          replayer_local._4_4_ = 1;
          goto LAB_0012d9e6;
        }
        hashes._4_4_ = 0;
        hashes._0_4_ = (uint)_end_index;
        local_3a0 = (pointer *)0x0;
        if (*(int *)tag_total_size_1 == 6) {
          local_3a0 = &compute_hashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,&(replayer->opts).end_graphics_index);
          hashes._0_4_ = *puVar14;
          puVar14 = std::max<unsigned_int>
                              ((uint *)((long)&hashes + 4),&(replayer->opts).start_graphics_index);
          hashes._4_4_ = *puVar14;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,(uint *)((long)&hashes + 4));
          hashes._4_4_ = *puVar14;
          raytracing_start_index = hashes._4_4_;
        }
        else if (*(int *)tag_total_size_1 == 7) {
          local_3a0 = &raytracing_hashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,&(replayer->opts).end_compute_index);
          hashes._0_4_ = *puVar14;
          puVar14 = std::max<unsigned_int>
                              ((uint *)((long)&hashes + 4),&(replayer->opts).start_compute_index);
          hashes._4_4_ = *puVar14;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,(uint *)((long)&hashes + 4));
          hashes._4_4_ = *puVar14;
          local_328 = hashes._4_4_;
        }
        else if (*(int *)tag_total_size_1 == 9) {
          local_3a0 = (pointer *)&compute_start_index;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,&(replayer->opts).end_raytracing_index);
          hashes._0_4_ = *puVar14;
          puVar14 = std::max<unsigned_int>
                              ((uint *)((long)&hashes + 4),&(replayer->opts).start_raytracing_index)
          ;
          hashes._4_4_ = *puVar14;
          puVar14 = std::min<unsigned_int>((uint *)&hashes,(uint *)((long)&hashes + 4));
          hashes._4_4_ = *puVar14;
          __range2_1._4_4_ = hashes._4_4_;
        }
        if (local_3a0 == (pointer *)0x0) {
          __assert_fail("hashes",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                        ,0xf3e,
                        "int run_normal_process(ThreadedReplayer &, const vector<const char *> &, const char *, uint32_t, intptr_t)"
                       );
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0,_end_index);
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = *(uint *)tag_total_size_1;
        puVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[6])(pDVar8,(ulong)uVar7,&end_index,puVar10);
        if ((uVar7 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to get list of resource hashes.\n");
          fflush(_stderr);
          replayer_local._4_4_ = 1;
          goto LAB_0012d9e6;
        }
        local_3b0._M_current =
             (unsigned_long *)
             std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        local_3a8 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_3b0,(ulong)hashes._4_4_);
        local_3c0._M_current =
             (unsigned_long *)
             std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        local_3b8 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_3c0,(ulong)(uint)hashes);
        local_3c8 = (unsigned_long *)
                    std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        local_3d0 = (unsigned_long *)
                    std::
                    move<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              (local_3a8,local_3b8,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )local_3c8);
        ppuVar5 = local_3a0;
        local_3e8._M_current =
             (unsigned_long *)
             std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        local_3e0 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_3e8,(ulong)((uint)hashes - hashes._4_4_));
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_3d8,&local_3e0);
        local_3f8._M_current =
             (unsigned_long *)
             std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_3f0,&local_3f8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar5,local_3d8,
                   local_3f0);
        bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&replayer->replayer_cache_db);
        if (bVar6) {
          uVar7 = *(uint *)tag_total_size_1;
          tag_00 = *(ResourceTag *)tag_total_size_1;
          iface = std::
                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ::operator*(&replayer->replayer_cache_db);
          populate_blob_hash_set(replayer->cached_blobs + uVar7,tag_00,iface);
        }
        ppuVar5 = local_3a0;
        __end3_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a0);
        hash_1 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar5);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&hash_1), bVar6) {
          puVar12 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end3_1);
          graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pDVar8 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                 *)&stack0xfffffffffffffe30);
          uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                            (pDVar8,(ulong)*(uint *)tag_total_size_1,*puVar12,
                             &graphics_workload.
                              super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
          if ((uVar7 & 1) != 0) {
            resource_hash_count_1 =
                 (long)&(graphics_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage)->order_index +
                 resource_hash_count_1;
          }
          pDVar8 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                 *)&stack0xfffffffffffffe30);
          uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                            (pDVar8,(ulong)*(uint *)tag_total_size_1,*puVar12,
                             &graphics_workload.
                              super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0,0);
          if ((uVar7 & 1) == 0) {
            fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
            fflush(_stderr);
            replayer_local._4_4_ = 1;
            goto LAB_0012d9e6;
          }
          tag_total_size_compressed_1 =
               (long)&(graphics_workload.
                       super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->order_index +
               tag_total_size_compressed_1;
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end3_1);
        }
        fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                run_normal_process::tag_names[*(uint *)tag_total_size_1]);
        fflush(_stderr);
      }
LAB_0012c514:
      pSVar15 = Fossilize::StateReplayer::get_allocator
                          ((StateReplayer *)
                           &resource_hashes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      Fossilize::ScratchAllocator::reset(pSVar15);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470);
      ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
                (replayer,replayer->deferred_graphics,&replayer->graphics_pipelines,
                 &replayer->graphics_parents,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,raytracing_start_index);
      ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredComputeInfo>
                (replayer,replayer->deferred_compute,&replayer->compute_pipelines,
                 &replayer->compute_parents,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &raytracing_hashes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_328);
      ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>
                (replayer,replayer->deferred_raytracing,&replayer->raytracing_pipelines,
                 &replayer->raytracing_parents,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compute_start_index,
                 __range2_1._4_4_);
      iVar16 = std::begin<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                          &compute_workload.
                           super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      iVar17 = std::end<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                          &compute_workload.
                           super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      std::
      sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>
                (iVar16._M_current,iVar17._M_current);
      iVar16 = std::begin<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                          &raytracing_workload.
                           super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      iVar17 = std::end<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                          &raytracing_workload.
                           super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      std::
      sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>
                (iVar16._M_current,iVar17._M_current);
      iVar16 = std::begin<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470);
      iVar17 = std::end<std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>
                         ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470);
      std::
      sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>
                (iVar16._M_current,iVar17._M_current);
      total_size = (unsigned_long)replayer;
      run_normal_process::anon_class_8_1_ce461c52::operator()
                ((anon_class_8_1_ce461c52 *)&total_size,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      run_normal_process::anon_class_8_1_ce461c52::operator()
                ((anon_class_8_1_ce461c52 *)&total_size,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      run_normal_process::anon_class_8_1_ce461c52::operator()
                ((anon_class_8_1_ce461c52 *)&total_size,
                 (vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470);
      ThreadedReplayer::tear_down_threads(replayer);
      pFVar4 = _stderr;
      pcVar3 = run_normal_process::tag_names[4];
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->shader_module_total_size).super___atomic_base<unsigned_long>._M_i;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      fprintf(pFVar4,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",pcVar3,_Var2
              ,(replayer->shader_module_total_compressed_size).super___atomic_base<unsigned_long>.
               _M_i);
      fflush(_stderr);
      sVar18 = std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::size(&replayer->compute_pipelines);
      replayer->compute_pipelines_cleared = sVar18 + replayer->compute_pipelines_cleared;
      sVar18 = std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::size(&replayer->graphics_pipelines);
      replayer->graphics_pipelines_cleared = sVar18 + replayer->graphics_pipelines_cleared;
      sVar18 = std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::size(&replayer->raytracing_pipelines);
      replayer->raytracing_pipelines_cleared = sVar18 + replayer->raytracing_pipelines_cleared;
      sVar19 = std::
               unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
               ::size(&replayer->samplers);
      sVar20 = std::
               unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
               ::size(&replayer->layouts);
      sVar21 = std::
               unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
               ::size(&replayer->pipeline_layouts);
      sVar22 = Fossilize::ObjectCache<VkShaderModule_T_*>::get_current_object_count
                         (&replayer->shader_modules);
      sVar23 = std::
               unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
               ::size(&replayer->render_passes);
      elapsed_ms_prepare =
           sVar19 + sVar20 + sVar21 + sVar22 + sVar23 + replayer->compute_pipelines_cleared +
           replayer->graphics_pipelines_cleared + replayer->raytracing_pipelines_cleared;
      elapsed_ms_read_archive =
           (long)std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&state_replayer,&end_prepare);
      local_4d8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&elapsed_ms_read_archive)
      ;
      local_4d0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_4d8);
      elapsed_ms = (long)std::chrono::operator-
                                   (&start_prepare,
                                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)&resolver);
      local_4f0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&elapsed_ms);
      local_4e8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_4f0);
      local_518.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_510.__r = (rep)std::chrono::operator-(&local_518,&start_create_archive);
      local_508.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_510);
      local_500 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_508);
      fprintf(_stderr,"Fossilize INFO: Opening archive took %ld ms:\n",local_4e8);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO: Parsing archive took %ld ms:\n",local_4d0);
      fflush(_stderr);
      uVar24 = std::__cxx11::string::empty();
      if ((uVar24 & 1) == 0) {
        this_01 = std::
                  unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ::operator->(&replayer->device);
        bVar6 = Fossilize::VulkanDevice::pipeline_feedback_enabled(this_01);
        pFVar4 = _stderr;
        if (bVar6) {
          std::operator&(memory_order_seq_cst,__memory_order_mask);
          fprintf(pFVar4,"Fossilize INFO: Pipeline cache hits reported: %u\n",
                  (ulong)(replayer->pipeline_cache_hits).super___atomic_base<unsigned_int>._M_i);
          fflush(_stderr);
          pFVar4 = _stderr;
          std::operator&(memory_order_seq_cst,__memory_order_mask);
          fprintf(pFVar4,"Fossilize INFO: Pipeline cache misses reported: %u\n",
                  (ulong)(replayer->pipeline_cache_misses).super___atomic_base<unsigned_int>._M_i);
          fflush(_stderr);
        }
      }
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar7 = (replayer->shader_module_count).super___atomic_base<unsigned_int>._M_i;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->shader_module_ns).super___atomic_base<unsigned_long>._M_i;
      auVar26._8_4_ = (int)(_Var2 >> 0x20);
      auVar26._0_8_ = _Var2;
      auVar26._12_4_ = 0x45300000;
      fprintf(pFVar4,
              "Fossilize INFO: Playing back %u shader modules took %.3f s (accumulated time)\n",
              ((auVar26._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09,(ulong)uVar7);
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      fprintf(pFVar4,"Fossilize INFO: Shader cache evicted %u shader modules in total\n",
              (ulong)(replayer->shader_module_evicted_count).super___atomic_base<unsigned_int>._M_i)
      ;
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar7 = (replayer->graphics_pipeline_count).super___atomic_base<unsigned_int>._M_i;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
      auVar27._8_4_ = (int)(_Var2 >> 0x20);
      auVar27._0_8_ = _Var2;
      auVar27._12_4_ = 0x45300000;
      fprintf(pFVar4,
              "Fossilize INFO: Playing back %u graphics pipelines took %.3f s (accumulated time)\n",
              ((auVar27._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09,(ulong)uVar7);
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar7 = (replayer->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
      auVar28._8_4_ = (int)(_Var2 >> 0x20);
      auVar28._0_8_ = _Var2;
      auVar28._12_4_ = 0x45300000;
      fprintf(pFVar4,
              "Fossilize INFO: Playing back %u compute pipelines took %.3f s (accumulated time)\n",
              ((auVar28._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09,(ulong)uVar7);
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar7 = (replayer->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
      auVar29._8_4_ = (int)(_Var2 >> 0x20);
      auVar29._0_8_ = _Var2;
      auVar29._12_4_ = 0x45300000;
      fprintf(pFVar4,
              "Fossilize INFO: Playing back %u raytracing pipelines took %.3f s (accumulated time)\n"
              ,((auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09,(ulong)uVar7)
      ;
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->total_idle_ns).super___atomic_base<unsigned_long>._M_i;
      auVar30._8_4_ = (int)(_Var2 >> 0x20);
      auVar30._0_8_ = _Var2;
      auVar30._12_4_ = 0x45300000;
      fprintf(pFVar4,"Fossilize INFO: Threads were idling in total for %.3f s (accumulated time)\n",
              ((auVar30._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09);
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->thread_total_ns).super___atomic_base<unsigned_long>._M_i;
      auVar31._8_4_ = (int)(_Var2 >> 0x20);
      auVar31._0_8_ = _Var2;
      auVar31._12_4_ = 0x45300000;
      fprintf(pFVar4,"Fossilize INFO: Threads were active in total for %.3f s (accumulated time)\n",
              ((auVar31._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 1e-09);
      fflush(_stderr);
      pFVar4 = _stderr;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      _Var2 = (replayer->total_peak_memory).super___atomic_base<unsigned_long>._M_i;
      pSVar15 = Fossilize::StateReplayer::get_allocator
                          ((StateReplayer *)
                           &resource_hashes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar22 = Fossilize::ScratchAllocator::get_peak_memory_consumption(pSVar15);
      lVar25 = _Var2 + sVar22;
      auVar32._8_4_ = (int)((ulong)lVar25 >> 0x20);
      auVar32._0_8_ = lVar25;
      auVar32._12_4_ = 0x45300000;
      fprintf(pFVar4,"Fossilize INFO: Total peak memory consumption by parser: %.3f MB.\n",
              ((auVar32._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) * 1e-06);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO: Replayed %lu objects in %ld ms:\n",elapsed_ms_prepare,
              local_500);
      fflush(_stderr);
      pFVar4 = _stderr;
      sVar19 = std::
               unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
               ::size(&replayer->samplers);
      fprintf(pFVar4,"Fossilize INFO:   samplers:              %7lu\n",sVar19);
      fflush(_stderr);
      pFVar4 = _stderr;
      sVar20 = std::
               unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
               ::size(&replayer->layouts);
      fprintf(pFVar4,"Fossilize INFO:   descriptor set layouts:%7lu\n",sVar20);
      fflush(_stderr);
      pFVar4 = _stderr;
      sVar21 = std::
               unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
               ::size(&replayer->pipeline_layouts);
      fprintf(pFVar4,"Fossilize INFO:   pipeline layouts:      %7lu\n",sVar21);
      fflush(_stderr);
      pFVar4 = _stderr;
      sVar23 = std::
               unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
               ::size(&replayer->render_passes);
      fprintf(pFVar4,"Fossilize INFO:   render passes:         %7lu\n",sVar23);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   compute pipelines:     %7lu\n",
              replayer->compute_pipelines_cleared);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   graphics pipelines:    %7lu\n",
              replayer->graphics_pipelines_cleared);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   raytracing pipelines:  %7lu\n",
              replayer->raytracing_pipelines_cleared);
      fflush(_stderr);
      replayer_local._4_4_ = 0;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)local_470);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector
                ((vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *)
                 &compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      __begin2_1 = run_normal_process::threaded_playback_order;
      tag_1 = (ResourceTag *)&DAT_003bb2ec;
      for (__end2_1 = run_normal_process::threaded_playback_order; __end2_1 != tag_1;
          __end2_1 = __end2_1 + 1) {
        state_json_size_1 = (size_t)__end2_1;
        __range2_2 = (ResourceTag (*) [3])0x0;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&stack0xfffffffffffffe30);
        uVar7 = (*pDVar8->_vptr_DatabaseInterface[3])
                          (pDVar8,(ulong)*(uint *)state_json_size_1,(replayer->opts).pipeline_hash,
                           &__range2_2,0,0);
        if ((uVar7 & 1) != 0) {
          if (*(int *)state_json_size_1 == 6) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &compute_hashes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&(replayer->opts).pipeline_hash);
          }
          else if (*(int *)state_json_size_1 == 7) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &raytracing_hashes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&(replayer->opts).pipeline_hash);
          }
          else if (*(int *)state_json_size_1 == 9) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compute_start_index
                       ,&(replayer->opts).pipeline_hash);
          }
        }
      }
      bVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &compute_hashes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (((!bVar6) ||
          (bVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &raytracing_hashes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar6)) ||
         (bVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &compute_start_index), !bVar6)) goto LAB_0012c514;
      fprintf(_stderr,"Fossilize ERROR: Specified pipeline hash %016lx not found in database.\n",
              (replayer->opts).pipeline_hash);
      fflush(_stderr);
      replayer_local._4_4_ = 1;
    }
LAB_0012d9e6:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&compute_start_index);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0012da0a:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Failed to initialize implicit whitelist.\n");
    fflush(_stderr);
    replayer_local._4_4_ = 1;
  }
  Fossilize::StateReplayer::~StateReplayer
            ((StateReplayer *)
             &resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0012da2e:
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&stack0xfffffffffffffe30);
  return replayer_local._4_4_;
}

Assistant:

static int run_normal_process(ThreadedReplayer &replayer, const vector<const char *> &databases,
                              const char *whitelist, uint32_t whitelist_mask,
                              intptr_t metadata_handle)
{
	auto start_time = chrono::steady_clock::now();
	auto start_create_archive = chrono::steady_clock::now();
	auto resolver = create_database(databases);

	if (whitelist)
	{
		resolver->set_whitelist_tag_mask(whitelist_mask);
		if (!resolver->load_whitelist_database(whitelist))
		{
			LOGE("Failed to load whitelist database: %s.\n", whitelist);
			return EXIT_FAILURE;
		}

		if (resolver->has_sub_databases())
			for (unsigned index : replayer.opts.implicit_whitelist_database_indices)
				resolver->promote_sub_database_to_whitelist(index);
	}

	if (DatabaseInterface::metadata_handle_is_valid(metadata_handle))
	{
		if (!resolver->import_metadata_from_os_handle(metadata_handle))
		{
			LOGE("Failed to import metadata.\n");
			return EXIT_FAILURE;
		}
	}

	auto end_create_archive = chrono::steady_clock::now();

	auto start_prepare = chrono::steady_clock::now();
	if (!resolver->prepare())
	{
		LOGE("Failed to prepare database.\n");
		return EXIT_FAILURE;
	}
	auto end_prepare = chrono::steady_clock::now();

	StateReplayer state_replayer;
	state_replayer.set_resolve_derivative_pipeline_handles(false);
	state_replayer.set_resolve_shader_module_handles(false);
	replayer.global_replayer = &state_replayer;
	replayer.global_database = resolver.get();

	if (!replayer.init_implicit_whitelist())
	{
		LOGE("Failed to initialize implicit whitelist.\n");
		return EXIT_FAILURE;
	}

	vector<Hash> resource_hashes;
	vector<uint8_t> state_json;

	static const ResourceTag initial_playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread. Dependent immutable samplers are pulled in on-demand.
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
	};

	static const ResourceTag threaded_playback_order[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : initial_playback_order)
	{
		auto main_thread_start = std::chrono::steady_clock::now();
		size_t tag_total_size = 0;
		size_t tag_total_size_compressed = 0;
		size_t resource_hash_count = 0;

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		resource_hashes.resize(resource_hash_count);

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, resource_hashes.data()))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		auto &per_thread_data = replayer.get_per_thread_data();
		per_thread_data.expected_tag = tag;

		for (auto &hash : resource_hashes)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			{
				tag_total_size_compressed += state_json_size;
			}			

			if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);
			tag_total_size += state_json_size;

			if (!resolver->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!state_replayer.parse(replayer, resolver.get(), state_json.data(), state_json.size()))
				LOGW("Did not replay blob (tag: %s, hash: %016" PRIx64 "). See previous logs for context.\n", tag_names[tag], hash);
		}

		if (tag == RESOURCE_APPLICATION_INFO)
		{
			// Just in case there was no application info in the database, we provide a dummy info,
			// this makes sure the VkDevice is created.
			replayer.set_application_info(0, nullptr, nullptr);
		}

		LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
		     uint64_t(tag_total_size),
		     uint64_t(tag_total_size_compressed));

		auto main_thread_end = std::chrono::steady_clock::now();
		auto duration = std::chrono::duration_cast<std::chrono::nanoseconds>(main_thread_end - main_thread_start).count();
		LOGI("Total time decoding %s in main thread: %.3f s\n", tag_names[tag], duration * 1e-9);
	}

	heartbeat();

	// Now we've laid the initial ground work, kick off worker threads.
	replayer.start_worker_threads();

	vector<Hash> graphics_hashes;
	vector<Hash> compute_hashes;
	vector<Hash> raytracing_hashes;
	unsigned graphics_start_index = 0;
	unsigned compute_start_index = 0;
	unsigned raytracing_start_index = 0;

	if (replayer.opts.pipeline_hash != 0)
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, replayer.opts.pipeline_hash, &state_json_size, nullptr, 0))
			{
				if (tag == RESOURCE_GRAPHICS_PIPELINE)
					graphics_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_COMPUTE_PIPELINE)
					compute_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_RAYTRACING_PIPELINE)
					raytracing_hashes.push_back(replayer.opts.pipeline_hash);
			}
		}

		if (graphics_hashes.empty() && compute_hashes.empty() && raytracing_hashes.empty())
		{
			LOGE("Specified pipeline hash %016" PRIx64 " not found in database.\n",
			     replayer.opts.pipeline_hash);
			return EXIT_FAILURE;
		}
	}
	else
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t tag_total_size = 0;
			size_t tag_total_size_compressed = 0;
			size_t resource_hash_count = 0;

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			unsigned start_index = 0;
			unsigned end_index = resource_hash_count;

			vector<Hash> *hashes = nullptr;

			if (tag == RESOURCE_GRAPHICS_PIPELINE)
			{
				hashes = &graphics_hashes;

				end_index = min(end_index, replayer.opts.end_graphics_index);
				start_index = max(start_index, replayer.opts.start_graphics_index);
				start_index = min(end_index, start_index);
				graphics_start_index = start_index;

			}
			else if (tag == RESOURCE_COMPUTE_PIPELINE)
			{
				hashes = &compute_hashes;

				end_index = min(end_index, replayer.opts.end_compute_index);
				start_index = max(start_index, replayer.opts.start_compute_index);
				start_index = min(end_index, start_index);
				compute_start_index = start_index;
			}
			else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			{
				hashes = &raytracing_hashes;

				end_index = min(end_index, replayer.opts.end_raytracing_index);
				start_index = max(start_index, replayer.opts.start_raytracing_index);
				start_index = min(end_index, start_index);
				raytracing_start_index = start_index;
			}

			assert(hashes);
			hashes->resize(resource_hash_count);

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, hashes->data()))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			move(begin(*hashes) + start_index, begin(*hashes) + end_index, begin(*hashes));
			hashes->erase(begin(*hashes) + (end_index - start_index), end(*hashes));

			if (replayer.replayer_cache_db)
				populate_blob_hash_set(replayer.cached_blobs[tag], tag, *replayer.replayer_cache_db);

			for (auto &hash : *hashes)
			{
				size_t state_json_size = 0;
				if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
				{
					tag_total_size_compressed += state_json_size;
				}

				if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
				{
					LOGE("Failed to load blob from cache.\n");
					return EXIT_FAILURE;
				}
				tag_total_size += state_json_size;
			}

			LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
			     uint64_t(tag_total_size),
			     uint64_t(tag_total_size_compressed));
		}
	}

	// Done parsing static objects.
	state_replayer.get_allocator().reset();

	vector<EnqueuedWork> graphics_workload;
	vector<EnqueuedWork> compute_workload;
	vector<EnqueuedWork> raytracing_workload;
	replayer.enqueue_deferred_pipelines(replayer.deferred_graphics, replayer.graphics_pipelines, replayer.graphics_parents,
	                                    graphics_workload,
	                                    graphics_hashes, graphics_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_compute, replayer.compute_pipelines, replayer.compute_parents,
	                                    compute_workload, compute_hashes,
	                                    compute_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_raytracing, replayer.raytracing_pipelines, replayer.raytracing_parents,
	                                    raytracing_workload, raytracing_hashes,
	                                    raytracing_start_index);

	sort(begin(graphics_workload), end(graphics_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(compute_workload), end(compute_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(raytracing_workload), end(raytracing_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});

	const auto run_work = [&replayer](const std::vector<EnqueuedWork> &workload) {
		for (auto &work : workload)
		{
			work.func();
			heartbeat();
		}

		// Need to synchronize worker threads between pipeline types to avoid a race condition
		// where memory iteration 1 for a GPL link is running, and then compute starts running
		// with only memory iteration 0 (< 1024 pipelines).
		// Then we get the pattern of:
		// - Link GPL pipeline iteration 1
		// - Sync memory context 0
		// - LRU maintenance memory context 0
		// - Free pipelines (race condition!)
		// To avoid shenanigans, synchronize everything between types.
		replayer.sync_worker_threads();
	};

	run_work(graphics_workload);
	run_work(compute_workload);
	run_work(raytracing_workload);

	replayer.tear_down_threads();

	LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[RESOURCE_SHADER_MODULE],
	     uint64_t(replayer.shader_module_total_size.load()),
	     uint64_t(replayer.shader_module_total_compressed_size.load()));

	replayer.compute_pipelines_cleared += replayer.compute_pipelines.size();
	replayer.graphics_pipelines_cleared += replayer.graphics_pipelines.size();
	replayer.raytracing_pipelines_cleared += replayer.raytracing_pipelines.size();

	unsigned long total_size =
		replayer.samplers.size() +
		replayer.layouts.size() +
		replayer.pipeline_layouts.size() +
		replayer.shader_modules.get_current_object_count() +
		replayer.render_passes.size() +
		replayer.compute_pipelines_cleared +
		replayer.graphics_pipelines_cleared +
		replayer.raytracing_pipelines_cleared;

	long elapsed_ms_prepare = chrono::duration_cast<chrono::milliseconds>(end_prepare - start_prepare).count();
	long elapsed_ms_read_archive = chrono::duration_cast<chrono::milliseconds>(end_create_archive - start_create_archive).count();
	long elapsed_ms = chrono::duration_cast<chrono::milliseconds>(chrono::steady_clock::now() - start_time).count();

	LOGI("Opening archive took %ld ms:\n", elapsed_ms_read_archive);
	LOGI("Parsing archive took %ld ms:\n", elapsed_ms_prepare);

	if (!replayer.opts.on_disk_pipeline_cache_path.empty() && replayer.device->pipeline_feedback_enabled())
	{
		LOGI("Pipeline cache hits reported: %u\n", replayer.pipeline_cache_hits.load());
		LOGI("Pipeline cache misses reported: %u\n", replayer.pipeline_cache_misses.load());
	}

	LOGI("Playing back %u shader modules took %.3f s (accumulated time)\n",
	     replayer.shader_module_count.load(),
	     replayer.shader_module_ns.load() * 1e-9);

	LOGI("Shader cache evicted %u shader modules in total\n",
	     replayer.shader_module_evicted_count.load());

	LOGI("Playing back %u graphics pipelines took %.3f s (accumulated time)\n",
	     replayer.graphics_pipeline_count.load(),
	     replayer.graphics_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u compute pipelines took %.3f s (accumulated time)\n",
	     replayer.compute_pipeline_count.load(),
	     replayer.compute_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u raytracing pipelines took %.3f s (accumulated time)\n",
	     replayer.raytracing_pipeline_count.load(),
	     replayer.raytracing_pipeline_ns.load() * 1e-9);

	LOGI("Threads were idling in total for %.3f s (accumulated time)\n",
	     replayer.total_idle_ns.load() * 1e-9);

	LOGI("Threads were active in total for %.3f s (accumulated time)\n",
	     replayer.thread_total_ns.load() * 1e-9);

	LOGI("Total peak memory consumption by parser: %.3f MB.\n",
	     (replayer.total_peak_memory.load() + state_replayer.get_allocator().get_peak_memory_consumption()) * 1e-6);

	LOGI("Replayed %lu objects in %ld ms:\n", total_size, elapsed_ms);
	LOGI("  samplers:              %7lu\n", (unsigned long)replayer.samplers.size());
	LOGI("  descriptor set layouts:%7lu\n", (unsigned long)replayer.layouts.size());
	LOGI("  pipeline layouts:      %7lu\n", (unsigned long)replayer.pipeline_layouts.size());
	LOGI("  render passes:         %7lu\n", (unsigned long)replayer.render_passes.size());
	LOGI("  compute pipelines:     %7lu\n", (unsigned long)replayer.compute_pipelines_cleared);
	LOGI("  graphics pipelines:    %7lu\n", (unsigned long)replayer.graphics_pipelines_cleared);
	LOGI("  raytracing pipelines:  %7lu\n", (unsigned long)replayer.raytracing_pipelines_cleared);

	return EXIT_SUCCESS;
}